

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

void __thiscall
Refal2::CVariablesBuilder::CVariablesBuilder(CVariablesBuilder *this,IErrorHandler *errorHandler)

{
  CVariableData *local_30;
  IErrorHandler *errorHandler_local;
  CVariablesBuilder *this_local;
  
  CErrorsHelper::CErrorsHelper(&this->super_CErrorsHelper,errorHandler);
  local_30 = this->variables;
  do {
    CVariableData::CVariableData(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (CVariableData *)&this->firstFreeVariableIndex);
  this->firstFreeVariableIndex = 0;
  Reset(this);
  return;
}

Assistant:

CVariablesBuilder::CVariablesBuilder( IErrorHandler* errorHandler ):
	CErrorsHelper( errorHandler ),
	firstFreeVariableIndex( 0 )
{
	Reset();
}